

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

void putRGBUAseparate8bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *r,uchar *g,uchar *b,uchar *a)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t *puVar5;
  uint32_t uVar6;
  long lVar7;
  
  if (h != 0) {
    lVar7 = (long)fromskew;
    do {
      if (w != 0) {
        puVar5 = img->UaToAa;
        uVar6 = w;
        do {
          bVar1 = *a;
          a = a + 1;
          bVar2 = *r;
          r = r + 1;
          bVar3 = *g;
          g = g + 1;
          bVar4 = *b;
          b = b + 1;
          *cp = (uint)bVar1 << 0x18 | (uint)puVar5[(ulong)bVar2 + (ulong)bVar1 * 0x100] |
                (uint)puVar5[(ulong)bVar3 + (ulong)bVar1 * 0x100] << 8 |
                (uint)puVar5[(ulong)bVar4 + (ulong)bVar1 * 0x100] << 0x10;
          cp = cp + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      r = r + lVar7;
      g = g + lVar7;
      b = b + lVar7;
      a = a + lVar7;
      cp = cp + toskew;
      h = h - 1;
    } while (h != 0);
  }
  return;
}

Assistant:

DECLARESepPutFunc(putRGBUAseparate8bittile)
{
    (void)img;
    (void)y;
    for (; h > 0; --h)
    {
        uint32_t rv, gv, bv, av;
        uint8_t *m;
        for (x = w; x > 0; --x)
        {
            av = *a++;
            m = img->UaToAa + ((size_t)av << 8);
            rv = m[*r++];
            gv = m[*g++];
            bv = m[*b++];
            *cp++ = PACK4(rv, gv, bv, av);
        }
        SKEW4(r, g, b, a, fromskew);
        cp += toskew;
    }
}